

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::PausableReadAsyncIoStream::tryReadImpl
          (PausableReadAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  undefined1 node [8];
  NullableValue<kj::Exception> _e1576;
  undefined1 local_4f8 [8];
  undefined1 local_4f0 [1224];
  
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
  (**(code **)(**(long **)((long)buffer + 0x18) + 8))(local_4f8);
  trackRead((Deferred<kj::Function<void_()>_> *)(local_4f0 + 8),(PausableReadAsyncIoStream *)buffer)
  ;
  Promise<unsigned_long>::attach<kj::_::Deferred<kj::Function<void()>>>
            ((Promise<unsigned_long> *)local_4f0,(Deferred<kj::Function<void_()>_> *)local_4f8);
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred
            ((Deferred<kj::Function<void_()>_> *)(local_4f0 + 8));
  node = local_4f8;
  if (local_4f8 != (undefined1  [8])0x0) {
    local_4f8 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)local_4f0._0_8_;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<size_t> PausableReadAsyncIoStream::tryReadImpl(
    void* buffer, size_t minBytes, size_t maxBytes) {
  // Hack: evalNow used here because `newAdaptedPromise` has a bug. We may need to change
  // `PromiseDisposer::alloc` to not be `noexcept` but in order to do so we'll need to benchmark
  // its performance.
  return kj::evalNow([&]() -> kj::Promise<size_t> {
    return inner->tryRead(buffer, minBytes, maxBytes).attach(trackRead());
  });
}